

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

int side1_8d_filter(double *p0,double *p1,double *q0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double local_120;
  double upper_bound_1;
  double lower_bound_1;
  double max2;
  double max1;
  double eps;
  int int_tmp_result;
  double q0_7_p0_7;
  double p1_7_p0_7;
  double q0_6_p0_6;
  double p1_6_p0_6;
  double q0_5_p0_5;
  double p1_5_p0_5;
  double q0_4_p0_4;
  double p1_4_p0_4;
  double q0_3_p0_3;
  double p1_3_p0_3;
  double q0_2_p0_2;
  double p1_2_p0_2;
  double q0_1_p0_1;
  double p1_1_p0_1;
  double q0_0_p0_0;
  double p1_0_p0_0;
  double r;
  double p0_7_p1_7;
  double p0_6_p1_6;
  double p0_5_p1_5;
  double p0_4_p1_4;
  double p0_3_p1_3;
  double p0_2_p1_2;
  double p0_1_p1_1;
  double p0_0_p1_0;
  double *q0_local;
  double *p1_local;
  double *p0_local;
  
  dVar1 = *p0 - *p1;
  dVar2 = p0[1] - p1[1];
  dVar3 = p0[2] - p1[2];
  dVar4 = p0[3] - p1[3];
  dVar5 = p0[4] - p1[4];
  dVar6 = p0[5] - p1[5];
  dVar7 = p0[6] - p1[6];
  dVar8 = p0[7] - p1[7];
  dVar9 = *p1 - *p0;
  dVar10 = *q0 - *p0;
  dVar11 = p1[1] - p0[1];
  dVar12 = q0[1] - p0[1];
  dVar13 = p1[2] - p0[2];
  dVar14 = q0[2] - p0[2];
  dVar15 = p1[3] - p0[3];
  dVar16 = q0[3] - p0[3];
  dVar17 = p1[4] - p0[4];
  dVar18 = q0[4] - p0[4];
  dVar19 = p1[5] - p0[5];
  dVar20 = q0[5] - p0[5];
  dVar21 = p1[6] - p0[6];
  dVar22 = q0[6] - p0[6];
  dVar23 = p1[7] - p0[7];
  dVar24 = q0[7] - p0[7];
  dVar25 = dVar23 * dVar24 +
           dVar21 * dVar22 +
           dVar19 * dVar20 +
           dVar17 * dVar18 + dVar15 * dVar16 + dVar13 * dVar14 + dVar9 * dVar10 + dVar11 * dVar12;
  dVar25 = (dVar8 * dVar8 +
           dVar7 * dVar7 +
           dVar6 * dVar6 +
           dVar5 * dVar5 + dVar4 * dVar4 + dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2) * 1.0 -
           (dVar25 + dVar25);
  max2 = ABS(dVar2);
  if (max2 < ABS(dVar3)) {
    max2 = ABS(dVar3);
  }
  if (max2 < ABS(dVar9)) {
    max2 = ABS(dVar9);
  }
  if (max2 < ABS(dVar1)) {
    max2 = ABS(dVar1);
  }
  if (max2 < ABS(dVar4)) {
    max2 = ABS(dVar4);
  }
  if (max2 < ABS(dVar5)) {
    max2 = ABS(dVar5);
  }
  if (max2 < ABS(dVar6)) {
    max2 = ABS(dVar6);
  }
  if (max2 < ABS(dVar7)) {
    max2 = ABS(dVar7);
  }
  if (max2 < ABS(dVar8)) {
    max2 = ABS(dVar8);
  }
  if (max2 < ABS(dVar11)) {
    max2 = ABS(dVar11);
  }
  if (max2 < ABS(dVar13)) {
    max2 = ABS(dVar13);
  }
  if (max2 < ABS(dVar15)) {
    max2 = ABS(dVar15);
  }
  if (max2 < ABS(dVar17)) {
    max2 = ABS(dVar17);
  }
  if (max2 < ABS(dVar19)) {
    max2 = ABS(dVar19);
  }
  if (max2 < ABS(dVar21)) {
    max2 = ABS(dVar21);
  }
  if (max2 < ABS(dVar23)) {
    max2 = ABS(dVar23);
  }
  lower_bound_1 = ABS(dVar2);
  if (lower_bound_1 < ABS(dVar3)) {
    lower_bound_1 = ABS(dVar3);
  }
  if (lower_bound_1 < ABS(dVar1)) {
    lower_bound_1 = ABS(dVar1);
  }
  if (lower_bound_1 < ABS(dVar4)) {
    lower_bound_1 = ABS(dVar4);
  }
  if (lower_bound_1 < ABS(dVar5)) {
    lower_bound_1 = ABS(dVar5);
  }
  if (lower_bound_1 < ABS(dVar6)) {
    lower_bound_1 = ABS(dVar6);
  }
  if (lower_bound_1 < ABS(dVar7)) {
    lower_bound_1 = ABS(dVar7);
  }
  if (lower_bound_1 < ABS(dVar8)) {
    lower_bound_1 = ABS(dVar8);
  }
  if (lower_bound_1 < ABS(dVar10)) {
    lower_bound_1 = ABS(dVar10);
  }
  if (lower_bound_1 < ABS(dVar12)) {
    lower_bound_1 = ABS(dVar12);
  }
  if (lower_bound_1 < ABS(dVar14)) {
    lower_bound_1 = ABS(dVar14);
  }
  if (lower_bound_1 < ABS(dVar16)) {
    lower_bound_1 = ABS(dVar16);
  }
  if (lower_bound_1 < ABS(dVar18)) {
    lower_bound_1 = ABS(dVar18);
  }
  if (lower_bound_1 < ABS(dVar20)) {
    lower_bound_1 = ABS(dVar20);
  }
  if (lower_bound_1 < ABS(dVar22)) {
    lower_bound_1 = ABS(dVar22);
  }
  if (lower_bound_1 < ABS(dVar24)) {
    lower_bound_1 = ABS(dVar24);
  }
  upper_bound_1 = max2;
  local_120 = max2;
  if (max2 <= lower_bound_1) {
    if (max2 < lower_bound_1) {
      local_120 = lower_bound_1;
    }
  }
  else {
    upper_bound_1 = lower_bound_1;
  }
  if (1.1554293109153009e-147 <= upper_bound_1) {
    if (local_120 <= 5.599361855444509e+101) {
      dVar1 = max2 * lower_bound_1 * 1.6667009016668223e-14;
      if (dVar25 <= dVar1) {
        if (-dVar1 <= dVar25) {
          return 0;
        }
        eps._4_4_ = -1;
      }
      else {
        eps._4_4_ = 1;
      }
      p0_local._4_4_ = eps._4_4_;
    }
    else {
      p0_local._4_4_ = 0;
    }
  }
  else {
    p0_local._4_4_ = 0;
  }
  return p0_local._4_4_;
}

Assistant:

inline int side1_8d_filter( const double* p0, const double* p1, const double* q0) {
    double p0_0_p1_0 = (p0[0] - p1[0]);
    double p0_1_p1_1 = (p0[1] - p1[1]);
    double p0_2_p1_2 = (p0[2] - p1[2]);
    double p0_3_p1_3 = (p0[3] - p1[3]);
    double p0_4_p1_4 = (p0[4] - p1[4]);
    double p0_5_p1_5 = (p0[5] - p1[5]);
    double p0_6_p1_6 = (p0[6] - p1[6]);
    double p0_7_p1_7 = (p0[7] - p1[7]);
    double r;
    r = (1 * ((((((((p0_0_p1_0 * p0_0_p1_0) + (p0_1_p1_1 * p0_1_p1_1)) + (p0_2_p1_2 * p0_2_p1_2)) + (p0_3_p1_3 * p0_3_p1_3)) + (p0_4_p1_4 * p0_4_p1_4)) + (p0_5_p1_5 * p0_5_p1_5)) + (p0_6_p1_6 * p0_6_p1_6)) + (p0_7_p1_7 * p0_7_p1_7)));
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    double p1_7_p0_7 = (p1[7] - p0[7]);
    double q0_7_p0_7 = (q0[7] - p0[7]);
    r = (r - (2 * ((((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6)) + (p1_7_p0_7 * q0_7_p0_7))));
    int int_tmp_result;
    double eps;
    double max1 = fabs(p0_1_p1_1);
    if( (max1 < fabs(p0_2_p1_2)) )
    {
        max1 = fabs(p0_2_p1_2);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    if( (max1 < fabs(p0_0_p1_0)) )
    {
        max1 = fabs(p0_0_p1_0);
    } 
    if( (max1 < fabs(p0_3_p1_3)) )
    {
        max1 = fabs(p0_3_p1_3);
    } 
    if( (max1 < fabs(p0_4_p1_4)) )
    {
        max1 = fabs(p0_4_p1_4);
    } 
    if( (max1 < fabs(p0_5_p1_5)) )
    {
        max1 = fabs(p0_5_p1_5);
    } 
    if( (max1 < fabs(p0_6_p1_6)) )
    {
        max1 = fabs(p0_6_p1_6);
    } 
    if( (max1 < fabs(p0_7_p1_7)) )
    {
        max1 = fabs(p0_7_p1_7);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_4_p0_4)) )
    {
        max1 = fabs(p1_4_p0_4);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    if( (max1 < fabs(p1_6_p0_6)) )
    {
        max1 = fabs(p1_6_p0_6);
    } 
    if( (max1 < fabs(p1_7_p0_7)) )
    {
        max1 = fabs(p1_7_p0_7);
    } 
    double max2 = fabs(p0_1_p1_1);
    if( (max2 < fabs(p0_2_p1_2)) )
    {
        max2 = fabs(p0_2_p1_2);
    } 
    if( (max2 < fabs(p0_0_p1_0)) )
    {
        max2 = fabs(p0_0_p1_0);
    } 
    if( (max2 < fabs(p0_3_p1_3)) )
    {
        max2 = fabs(p0_3_p1_3);
    } 
    if( (max2 < fabs(p0_4_p1_4)) )
    {
        max2 = fabs(p0_4_p1_4);
    } 
    if( (max2 < fabs(p0_5_p1_5)) )
    {
        max2 = fabs(p0_5_p1_5);
    } 
    if( (max2 < fabs(p0_6_p1_6)) )
    {
        max2 = fabs(p0_6_p1_6);
    } 
    if( (max2 < fabs(p0_7_p1_7)) )
    {
        max2 = fabs(p0_7_p1_7);
    } 
    if( (max2 < fabs(q0_0_p0_0)) )
    {
        max2 = fabs(q0_0_p0_0);
    } 
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q0_2_p0_2)) )
    {
        max2 = fabs(q0_2_p0_2);
    } 
    if( (max2 < fabs(q0_3_p0_3)) )
    {
        max2 = fabs(q0_3_p0_3);
    } 
    if( (max2 < fabs(q0_4_p0_4)) )
    {
        max2 = fabs(q0_4_p0_4);
    } 
    if( (max2 < fabs(q0_5_p0_5)) )
    {
        max2 = fabs(q0_5_p0_5);
    } 
    if( (max2 < fabs(q0_6_p0_6)) )
    {
        max2 = fabs(q0_6_p0_6);
    } 
    if( (max2 < fabs(q0_7_p0_7)) )
    {
        max2 = fabs(q0_7_p0_7);
    } 
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (lower_bound_1 < 1.15542931091530087067e-147) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 5.59936185544450928309e+101) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.66670090166682227006e-14 * (max1 * max2));
        if( (r > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return int_tmp_result;
}